

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# download.cc
# Opt level: O1

int set_socket_option(int sock)

{
  int iVar1;
  undefined8 uVar2;
  timeval timeout;
  undefined8 local_18;
  undefined8 local_10;
  
  local_18 = 10;
  local_10 = 0;
  iVar1 = setsockopt(sock,1,0x15,&local_18,0x10);
  if (iVar1 == -1) {
    uVar2 = 0x91;
  }
  else {
    iVar1 = setsockopt(sock,1,0x14,&local_18,0x10);
    if (iVar1 != -1) {
      return 0;
    }
    uVar2 = 0x98;
  }
  printf("[%s][%s(%d)]:setsockopt error: %m\n","MSG_ERROR","set_socket_option",uVar2);
  return -1;
}

Assistant:

int set_socket_option(int sock) {
  struct timeval timeout;

  timeout.tv_sec = RCV_SND_TIMEOUT / 1000;
  timeout.tv_usec = RCV_SND_TIMEOUT % 1000 * 1000;
  lprintf(MSG_DEBUG, "%ds %dus\n", (int)timeout.tv_sec, (int)timeout.tv_usec);
  // set socket is success.

  // set send time out status
  if (-1 == setsockopt(sock, SOL_SOCKET, SO_SNDTIMEO, (char *)&timeout,
                       sizeof(struct timeval))) {
    lprintf(MSG_ERROR, "setsockopt error: %m\n");
    return -1;
  }

  // set receive time out staus
  if (-1 == setsockopt(sock, SOL_SOCKET, SO_RCVTIMEO, (char *)&timeout,
                       sizeof(struct timeval))) {
    lprintf(MSG_ERROR, "setsockopt error: %m\n");
    return -1;
  }

  return 0;
}